

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Array<kj::(anonymous_namespace)::TestObject> * __thiscall
kj::Arena::allocateOwnArray<kj::(anonymous_namespace)::TestObject>
          (Array<kj::(anonymous_namespace)::TestObject> *__return_storage_ptr__,Arena *this,
          size_t size)

{
  TestObject *pTVar1;
  Array<kj::(anonymous_namespace)::TestObject> *result;
  long lVar2;
  bool bVar3;
  ArrayBuilder<kj::(anonymous_namespace)::TestObject> local_58;
  
  lVar2 = 0;
  pTVar1 = (TestObject *)allocateBytes(this,size * 4,4,false);
  local_58.endPtr = pTVar1 + size;
  local_58.disposer = (ArrayDisposer *)&DestructorOnlyArrayDisposer::instance;
  local_58.ptr = pTVar1;
  while (bVar3 = size != 0, size = size - 1, bVar3) {
    ctor<kj::(anonymous_namespace)::TestObject>((TestObject *)((long)&pTVar1->index + lVar2));
    lVar2 = lVar2 + 4;
  }
  __return_storage_ptr__->ptr = pTVar1;
  __return_storage_ptr__->size_ = lVar2 >> 2;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&DestructorOnlyArrayDisposer::instance;
  local_58.ptr = (TestObject *)0x0;
  local_58.pos = (RemoveConst<kj::(anonymous_namespace)::TestObject> *)0x0;
  local_58.endPtr = (TestObject *)0x0;
  ArrayBuilder<kj::(anonymous_namespace)::TestObject>::~ArrayBuilder(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Array<T> Arena::allocateOwnArray(size_t size) {
  ArrayBuilder<T> result = allocateOwnArrayBuilder<T>(size);
  for (size_t i = 0; i < size; i++) {
    result.add();
  }
  return result.finish();
}